

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::map_slot_policy<std::shared_ptr<vmips::VirtReg>,unsigned_long>::
     transfer<std::allocator<std::pair<std::shared_ptr<vmips::VirtReg>const,unsigned_long>>>
               (allocator<std::pair<const_std::shared_ptr<vmips::VirtReg>,_unsigned_long>_> *alloc,
               slot_type *new_slot,slot_type *old_slot)

{
  slot_type *old_slot_local;
  slot_type *new_slot_local;
  allocator<std::pair<const_std::shared_ptr<vmips::VirtReg>,_unsigned_long>_> *alloc_local;
  
  map_slot_policy<std::shared_ptr<vmips::VirtReg>,_unsigned_long>::emplace(new_slot);
  allocator_traits<std::allocator<std::pair<std::shared_ptr<vmips::VirtReg>const,unsigned_long>>>::
  construct<std::pair<std::shared_ptr<vmips::VirtReg>,unsigned_long>,std::pair<std::shared_ptr<vmips::VirtReg>,unsigned_long>>
            (alloc,(pair<std::shared_ptr<vmips::VirtReg>,_unsigned_long> *)&new_slot->value,
             (pair<std::shared_ptr<vmips::VirtReg>,_unsigned_long> *)&old_slot->value);
  destroy<std::allocator<std::pair<std::shared_ptr<vmips::VirtReg>const,unsigned_long>>>
            (alloc,old_slot);
  return;
}

Assistant:

static void transfer(Allocator* alloc, slot_type* new_slot,
                         slot_type* old_slot) {
        emplace(new_slot);
        if (kMutableKeys::value) {
            phmap::allocator_traits<Allocator>::construct(
                *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
        } else {
            phmap::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
                                                         std::move(old_slot->value));
        }
        destroy(alloc, old_slot);
    }